

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupStrashReduce(Gia_Man_t *p,Vec_Wec_t *vSupps,Vec_Int_t **pvCoMap)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xfe5,"Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)"
                 );
  }
  Gia_ManFillValue(p);
  p_00 = Vec_IntAlloc(p->vCos->nSize);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  p->pObjs->Value = 0;
  iVar1 = Gia_ManCoSuppSizeMax(p,vSupps);
  iVar8 = 0;
  if (0 < iVar1) {
    iVar8 = iVar1;
  }
  while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
    Gia_ManAppendCi(p_01);
  }
  Gia_ManHashAlloc(p_01);
  for (iVar8 = 0; iVar8 < p->vCos->nSize; iVar8 = iVar8 + 1) {
    pObj = Gia_ManCo(p,iVar8);
    if (pObj == (Gia_Obj_t *)0x0) break;
    pVVar5 = Vec_WecEntry(vSupps,iVar8);
    iVar1 = pVVar5->nSize;
    if (iVar1 == 0) {
      uVar2 = *(uint *)pObj;
      iVar1 = 0;
LAB_001de82e:
      iVar1 = Abc_Var2Lit(iVar1,uVar2 >> 0x1d & 1);
      Vec_IntPush(p_00,iVar1);
    }
    else {
      if (iVar1 == 1) {
        uVar2 = *(uint *)pObj;
        iVar1 = 1;
        goto LAB_001de82e;
      }
      for (iVar9 = 0; iVar9 < iVar1; iVar9 = iVar9 + 1) {
        iVar1 = Vec_IntEntry(pVVar5,iVar9);
        pGVar6 = Gia_ManCi(p_01,iVar9);
        uVar2 = Gia_Obj2Lit(p_01,pGVar6);
        pGVar6 = Gia_ManCi(p,iVar1);
        pGVar6->Value = uVar2;
        iVar1 = pVVar5->nSize;
      }
      Gia_ManDupHashDfs_rec(p_01,p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
      iVar1 = Gia_ObjFanin0Copy(pObj);
      if (p_01->nObjs * 2 <= iVar1) {
        __assert_fail("Gia_ObjFanin0Copy(pObj) < 2 * Gia_ManObjNum(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                      ,0xffc,
                      "Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)");
      }
      iVar1 = Gia_ObjFanin0Copy(pObj);
      Vec_IntPush(p_00,iVar1);
      Gia_ManDupCleanDfs_rec(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
    }
  }
  Gia_ManHashStop(p_01);
  iVar8 = p_00->nSize;
  if (iVar8 == p->vCos->nSize) {
    if (pvCoMap == (Vec_Int_t **)0x0) {
      iVar1 = 0;
      if (iVar8 < 1) {
        iVar8 = iVar1;
      }
      for (; iVar8 != iVar1; iVar1 = iVar1 + 1) {
        iVar9 = Vec_IntEntry(p_00,iVar1);
        Gia_ManAppendCo(p_01,iVar9);
      }
    }
    else {
      pVVar5 = Vec_IntAlloc(iVar8);
      iVar1 = p_01->nObjs;
      iVar9 = iVar1 * 2;
      p_02 = Vec_IntAlloc(iVar9);
      p_02->nSize = iVar9;
      if (p_02->pArray != (int *)0x0) {
        memset(p_02->pArray,0xff,(long)iVar1 << 3);
      }
      iVar1 = 0;
      if (iVar8 < 1) {
        iVar8 = iVar1;
      }
      for (; iVar8 != iVar1; iVar1 = iVar1 + 1) {
        iVar9 = Vec_IntEntry(p_00,iVar1);
        iVar3 = Vec_IntEntry(p_02,iVar9);
        if (iVar3 == -1) {
          Vec_IntWriteEntry(p_02,iVar9,p_01->vCos->nSize);
          Gia_ManAppendCo(p_01,iVar9);
        }
        iVar9 = Vec_IntEntry(p_02,iVar9);
        Vec_IntPush(pVVar5,iVar9);
      }
      Vec_IntFree(p_02);
      *pvCoMap = pVVar5;
    }
    Vec_IntFree(p_00);
    pGVar7 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
    return pGVar7;
  }
  __assert_fail("Vec_IntSize(vCoMapLit) == Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x1002,"Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)")
  ;
}

Assistant:

Gia_Man_t * Gia_ManDupStrashReduce( Gia_Man_t * p, Vec_Wec_t * vSupps, Vec_Int_t ** pvCoMap )
{
    Gia_Obj_t * pObj;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vSuppOne, * vCoMapLit;
    int i, k, iCi, iLit, nSuppMax;
    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManFillValue( p );
    vCoMapLit = Vec_IntAlloc( Gia_ManCoNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    nSuppMax = Gia_ManCoSuppSizeMax( p, vSupps );
    for ( i = 0; i < nSuppMax; i++ )
        Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( Vec_IntSize(vSuppOne) == 0 )
            Vec_IntPush( vCoMapLit, Abc_Var2Lit(0, Gia_ObjFaninC0(pObj)) );
        else if ( Vec_IntSize(vSuppOne) == 1 )
            Vec_IntPush( vCoMapLit, Abc_Var2Lit(1, Gia_ObjFaninC0(pObj)) );
        else
        {
            Vec_IntForEachEntry( vSuppOne, iCi, k )
                Gia_ManCi(p, iCi)->Value = Gia_Obj2Lit(pNew, Gia_ManCi(pNew, k) );
            Gia_ManDupHashDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
            assert( Gia_ObjFanin0Copy(pObj) < 2 * Gia_ManObjNum(pNew) );
            Vec_IntPush( vCoMapLit, Gia_ObjFanin0Copy(pObj) );
            Gia_ManDupCleanDfs_rec( Gia_ObjFanin0(pObj) );
        }
    }
    Gia_ManHashStop( pNew );
    assert( Vec_IntSize(vCoMapLit) == Gia_ManCoNum(p) );
    if ( pvCoMap == NULL ) // do not remap
    {
        Vec_IntForEachEntry( vCoMapLit, iLit, i )
            Gia_ManAppendCo( pNew, iLit );
    }
    else // remap
    {
        Vec_Int_t * vCoMapRes = Vec_IntAlloc( Gia_ManCoNum(p) );      // map old CO into new CO 
        Vec_Int_t * vMap = Vec_IntStartFull( 2*Gia_ManObjNum(pNew) ); // map new lit into new CO
        Vec_IntForEachEntry( vCoMapLit, iLit, i )
        {
            if ( Vec_IntEntry(vMap, iLit) == -1 )
            {
                Vec_IntWriteEntry( vMap, iLit, Gia_ManCoNum(pNew) );
                Gia_ManAppendCo( pNew, iLit );
            }
            Vec_IntPush( vCoMapRes, Vec_IntEntry(vMap, iLit) );
        }
        Vec_IntFree( vMap );
        *pvCoMap = vCoMapRes;
    }
    Vec_IntFree( vCoMapLit );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}